

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O1

void __thiscall CppGenerator::~CppGenerator(CppGenerator *this)

{
  ~CppGenerator(this);
  operator_delete(this);
  return;
}

Assistant:

CppGenerator::~CppGenerator()
{
    delete[] viewName;
    for (size_t rel = 0; rel < _td->numberOfRelations() + _qc->numberOfViews(); ++rel)
        delete[] sortOrders[rel];
    delete[] sortOrders;
    delete[] viewLevelRegister;
}